

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall Liby::http::HttpServer::handleReadEvent(HttpServer *this,Connection *conn)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  Buffer *this_01;
  char *pcVar3;
  char *pcVar4;
  off_t oVar5;
  Logger *this_02;
  element_type *this_03;
  mapped_type *pmVar6;
  size_t in_RCX;
  int errcode;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int __flags;
  char *in_R8;
  double __x;
  allocator local_291;
  key_type local_290;
  anon_class_40_3_28e774d3 local_270;
  function<void_()> local_248;
  string local_228;
  enable_shared_from_this<Liby::Connection> local_208;
  undefined1 local_1f8 [8];
  weak_ptr<Liby::Connection> weak_conn_1;
  key_type local_1e0;
  string local_1c0;
  allocator local_199;
  key_type local_198;
  string local_178;
  undefined1 local_158 [8];
  Reply rep;
  char *err;
  long filesize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  fdPtr fp;
  function<void_()> local_a0;
  string local_70;
  enable_shared_from_this<Liby::Connection> local_50;
  undefined1 local_40 [8];
  weak_ptr<Liby::Connection> weak_conn;
  int savedBytes;
  Buffer *readBuf;
  HttpContext *context;
  Connection *conn_local;
  HttpServer *this_local;
  
  pcVar3 = (char *)conn;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&conn->context_);
  if (!bVar1) {
    __assert_fail("conn.context_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp"
                  ,0x1d,"void Liby::http::HttpServer::handleReadEvent(Connection &)");
  }
  peVar2 = std::__shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(conn->context_).
                       super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>);
  __buf = extraout_RDX;
  do {
    this_01 = (Buffer *)Connection::read(conn,(int)pcVar3,__buf,in_RCX);
    bVar1 = Buffer::empty(this_01);
    if (bVar1) {
      return;
    }
    weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = *(int *)((long)&peVar2[0x16]._vptr_BaseContext + 4);
    pcVar3 = Buffer::data(this_01);
    pcVar4 = Buffer::data(this_01);
    oVar5 = Buffer::size(this_01);
    RequestParser::parse((RequestParser *)(peVar2 + 2),pcVar3,pcVar4 + oVar5);
    Buffer::retrieve(this_01,(long)(*(int *)((long)&peVar2[0x16]._vptr_BaseContext + 4) -
                                   weak_conn.
                                   super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi._4_4_));
    bVar1 = RequestParser::isError((RequestParser *)(peVar2 + 2));
    __flags = (int)in_R8;
    if (bVar1) {
      std::enable_shared_from_this<Liby::Connection>::shared_from_this(&local_50);
      std::weak_ptr<Liby::Connection>::weak_ptr<Liby::Connection,void>
                ((weak_ptr<Liby::Connection> *)local_40,(shared_ptr<Liby::Connection> *)&local_50);
      std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)&local_50);
      Reply::Error_abi_cxx11_(&local_70,(Reply *)0x194,errcode);
      this_00 = &fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      std::weak_ptr<Liby::Connection>::weak_ptr
                ((weak_ptr<Liby::Connection> *)this_00,(weak_ptr<Liby::Connection> *)local_40);
      std::function<void()>::
      function<Liby::http::HttpServer::handleReadEvent(Liby::Connection&)::__0,void>
                ((function<void()> *)&local_a0,(anon_class_16_1_c47b3a33 *)this_00);
      Connection::send(conn,(int)&local_70,&local_a0,in_RCX,__flags);
      std::function<void_()>::~function(&local_a0);
      handleReadEvent(Liby::Connection&)::$_0::~__0
                ((__0 *)&fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      std::__cxx11::string::~string((string *)&local_70);
      std::weak_ptr<Liby::Connection>::~weak_ptr((weak_ptr<Liby::Connection> *)local_40);
      return;
    }
    bVar1 = RequestParser::isGood((RequestParser *)(peVar2 + 2));
    if (!bVar1) {
      return;
    }
    std::operator+(&local_e0,&this->root_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar2 + 3)
                  );
    FileDescriptor::openFile((FileDescriptor *)local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c0);
    if (bVar1) {
      this_03 = std::
                __shared_ptr_access<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_c0);
      oVar5 = FileDescriptor::getFileSize(this_03);
      Reply::Reply((Reply *)local_158);
      local_158._0_4_ = 200;
      std::__cxx11::to_string(&local_178,oVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"Content-Length",&local_199);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&rep.content_.capacity_,&local_198);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::__cxx11::string::~string((string *)&local_178);
      getMimeType(&local_1c0,(string *)(peVar2 + 3));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e0,"Content-Type",
                 (allocator *)
                 ((long)&weak_conn_1.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&rep.content_.capacity_,&local_1e0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&weak_conn_1.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      std::__cxx11::string::~string((string *)&local_1c0);
      std::enable_shared_from_this<Liby::Connection>::shared_from_this(&local_208);
      std::weak_ptr<Liby::Connection>::weak_ptr<Liby::Connection,void>
                ((weak_ptr<Liby::Connection> *)local_1f8,(shared_ptr<Liby::Connection> *)&local_208)
      ;
      std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)&local_208);
      Reply::toString_abi_cxx11_(&local_228,(Reply *)local_158);
      std::shared_ptr<Liby::FileDescriptor>::shared_ptr
                (&local_270.fp,(shared_ptr<Liby::FileDescriptor> *)local_c0);
      std::weak_ptr<Liby::Connection>::weak_ptr
                (&local_270.weak_conn,(weak_ptr<Liby::Connection> *)local_1f8);
      local_270.filesize = oVar5;
      std::function<void()>::
      function<Liby::http::HttpServer::handleReadEvent(Liby::Connection&)::__1,void>
                ((function<void()> *)&local_248,&local_270);
      Connection::send(conn,(int)&local_228,&local_248,in_RCX,(int)in_R8);
      std::function<void_()>::~function(&local_248);
      handleReadEvent(Liby::Connection&)::$_1::~__1((__1 *)&local_270);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_290,"Connection",&local_291);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(peVar2 + 0xb),&local_290);
      pcVar3 = "keep-alive";
      bVar1 = std::operator!=(pmVar6,"keep-alive");
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      if (bVar1) {
        *(undefined1 *)&peVar2[1]._vptr_BaseContext = 0;
        filesize._4_4_ = 3;
      }
      else {
        RequestParser::clear((RequestParser *)(peVar2 + 2));
        filesize._4_4_ = 0;
      }
      std::weak_ptr<Liby::Connection>::~weak_ptr((weak_ptr<Liby::Connection> *)local_1f8);
      Reply::~Reply((Reply *)local_158);
    }
    else {
      this_02 = Logger::getLogger();
      in_R8 = "handleReadEvent";
      pcVar3 = (char *)0x4;
      in_RCX = 0x38;
      Logger::log(this_02,__x);
      filesize._4_4_ = 1;
    }
    std::shared_ptr<Liby::FileDescriptor>::~shared_ptr((shared_ptr<Liby::FileDescriptor> *)local_c0)
    ;
    __buf = extraout_RDX_00;
  } while (filesize._4_4_ == 0);
  return;
}

Assistant:

void HttpServer::handleReadEvent(Connection &conn) {
    assert(conn.context_);

    HttpContext *context = static_cast<HttpContext *>(conn.context_.get());

    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = context->requestParser.bytes_;
        context->requestParser.parse(readBuf.data(),
                                     readBuf.data() + readBuf.size());
        readBuf.retrieve(context->requestParser.bytes_ - savedBytes);

        if (context->requestParser.isError()) {
            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(Reply::Error(404), [weak_conn] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->destroy();
                }
            });
            break;
        } else if (context->requestParser.isGood()) {
            auto fp =
                FileDescriptor::openFile(root_ + context->requestParser.uri_);
            if (!fp) {
                error("fp is null");
                return;
            }

            long filesize;
            try {
                filesize = fp->getFileSize();
            } catch (const char *err) {
                error("%s", err);
                // send error response
                break;
            }

            Reply rep;
            rep.status_ = HTTP_OK;
            rep.headers_["Content-Length"] = std::to_string(filesize);
            rep.headers_["Content-Type"] =
                getMimeType(context->requestParser.uri_);

            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(rep.toString(), [fp, weak_conn, filesize] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->sendFile(fp, 0, filesize, [conn] {
                        HttpContext *context =
                            static_cast<HttpContext *>(conn->context_.get());
                        if (!context->keep_alive_)
                            conn->destroyLater();
                    });
                }
            });
            if (context->requestParser.headers_["Connection"] != "keep-alive") {
                context->keep_alive_ = false;
                break;
            }
            context->requestParser.clear();
        } else {
            break;
        }
    }
}